

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::SingleFailureChecker::~SingleFailureChecker(SingleFailureChecker *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_30;
  Message local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  SingleFailureChecker *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  HasOneFailure(local_20,"*results_","type_",(TestPartResultArray *)"substr_",(Type)this->results_,
                (string *)(ulong)this->type_);
  bVar1 = AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    Message::Message(&local_28);
    message = AssertionResult::failure_message((AssertionResult *)local_20);
    AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/googletest/src/gtest.cc"
               ,0x291,message);
    AssertHelper::operator=(&local_30,&local_28);
    AssertHelper::~AssertHelper(&local_30);
    Message::~Message(&local_28);
  }
  AssertionResult::~AssertionResult((AssertionResult *)local_20);
  std::__cxx11::string::~string((string *)&this->substr_);
  return;
}

Assistant:

SingleFailureChecker::~SingleFailureChecker() {
  EXPECT_PRED_FORMAT3(HasOneFailure, *results_, type_, substr_);
}